

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

void ssh2_transport_reconfigure(PacketProtocolLayer *ppl,Conf *conf)

{
  PktInQueue *pPVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  unsigned_long uVar6;
  long lVar7;
  Interactor *pIVar8;
  bool bVar9;
  unsigned_long diff_1;
  unsigned_long diff;
  int i;
  unsigned_long rekey_time;
  unsigned_long old_max_data_size;
  char *pcStack_28;
  _Bool rekey_mandatory;
  char *rekey_reason;
  ssh2_transport_state *s;
  Conf *conf_local;
  PacketProtocolLayer *ppl_local;
  
  pcStack_28 = (char *)0x0;
  if (ppl->vt == &ssh2_transport_vtable) {
    iVar4 = conf_get_int(conf,0x1b);
    uVar6 = sanitise_rekey_time(iVar4,0x3c);
    _Var2 = ssh2_transport_timer_update((ssh2_transport_state *)&ppl[-0xd].ic_process_queue,uVar6);
    if (_Var2) {
      pcStack_28 = "timeout shortened";
    }
    pPVar1 = ppl[-0xb].in_pq;
    ssh2_transport_set_max_data_size((ssh2_transport_state *)&ppl[-0xd].ic_process_queue);
    if ((pPVar1 != ppl[-0xb].in_pq) && (ppl[-0xb].in_pq != (PktInQueue *)0x0)) {
      if (ppl[-0xb].in_pq < pPVar1) {
        uVar6 = (long)pPVar1 - (long)ppl[-0xb].in_pq;
        dts_consume((DataTransferStatsDirection *)&(ppl[-10].ssh)->conf,uVar6);
        dts_consume((DataTransferStatsDirection *)ppl[-10].ssh,uVar6);
        if ((((ulong)(ppl[-10].ssh)->conf & 0x100) != 0) ||
           (((ulong)(ppl[-10].ssh)->s & 0x100) != 0)) {
          pcStack_28 = "data limit lowered";
        }
      }
      else {
        lVar7 = (long)ppl[-0xb].in_pq - (long)pPVar1;
        if (((ulong)(ppl[-10].ssh)->conf & 1) != 0) {
          ((ppl[-10].ssh)->version_receiver).got_ssh_version =
               ((ppl[-10].ssh)->version_receiver).got_ssh_version + lVar7;
        }
        if (((ulong)(ppl[-10].ssh)->s & 1) != 0) {
          (ppl[-10].ssh)->seat = (Seat *)(lVar7 + (long)(ppl[-10].ssh)->seat);
        }
      }
    }
    _Var2 = conf_get_bool((Conf *)ppl[-0xc].interactor,0x17);
    _Var3 = conf_get_bool(conf,0x17);
    bVar9 = _Var2 != _Var3;
    if (bVar9) {
      pcStack_28 = "compression setting changed";
    }
    for (diff._4_4_ = 0; diff._4_4_ < 7; diff._4_4_ = diff._4_4_ + 1) {
      iVar4 = conf_get_int_int((Conf *)ppl[-0xc].interactor,0x20,diff._4_4_);
      iVar5 = conf_get_int_int(conf,0x20,diff._4_4_);
      if (iVar4 != iVar5) {
        pcStack_28 = "cipher settings changed";
        bVar9 = true;
      }
    }
    _Var2 = conf_get_bool((Conf *)ppl[-0xc].interactor,0x24);
    _Var3 = conf_get_bool(conf,0x24);
    if (_Var2 != _Var3) {
      pcStack_28 = "cipher settings changed";
      bVar9 = true;
    }
    conf_free((Conf *)ppl[-0xc].interactor);
    pIVar8 = (Interactor *)conf_copy(conf);
    ppl[-0xc].interactor = pIVar8;
    if ((PacketProtocolLayerVtable *)pcStack_28 != (PacketProtocolLayerVtable *)0x0) {
      if ((((ulong)ppl[-9].in_pq & 1) != 0) || (_Var2 = ssh2_bpp_rekey_inadvisable(ppl->bpp), _Var2)
         ) {
        if (bVar9) {
          ppl[-9].ic_process_queue.ctx = pcStack_28;
        }
      }
      else {
        ppl[-0xb].vt = (PacketProtocolLayerVtable *)pcStack_28;
        *(undefined4 *)&ppl[-0xb].bpp = 3;
        queue_idempotent_callback(&ppl->ic_process_queue);
      }
    }
    ssh_ppl_reconfigure((PacketProtocolLayer *)ppl[-0xd].ic_process_queue.ctx,conf);
    return;
  }
  __assert_fail("ppl->vt == &ssh2_transport_vtable",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transport2.c"
                ,0x86e,"void ssh2_transport_reconfigure(PacketProtocolLayer *, Conf *)");
}

Assistant:

static void ssh2_transport_reconfigure(PacketProtocolLayer *ppl, Conf *conf)
{
    struct ssh2_transport_state *s;
    const char *rekey_reason = NULL;
    bool rekey_mandatory = false;
    unsigned long old_max_data_size, rekey_time;
    int i;

    assert(ppl->vt == &ssh2_transport_vtable);
    s = container_of(ppl, struct ssh2_transport_state, ppl);

    rekey_time = sanitise_rekey_time(
        conf_get_int(conf, CONF_ssh_rekey_time), 60);
    if (ssh2_transport_timer_update(s, rekey_time))
        rekey_reason = "timeout shortened";

    old_max_data_size = s->max_data_size;
    ssh2_transport_set_max_data_size(s);
    if (old_max_data_size != s->max_data_size &&
        s->max_data_size != 0) {
        if (s->max_data_size < old_max_data_size) {
            unsigned long diff = old_max_data_size - s->max_data_size;

            dts_consume(&s->stats->out, diff);
            dts_consume(&s->stats->in, diff);
            if (s->stats->out.expired || s->stats->in.expired)
                rekey_reason = "data limit lowered";
        } else {
            unsigned long diff = s->max_data_size - old_max_data_size;
            if (s->stats->out.running)
                s->stats->out.remaining += diff;
            if (s->stats->in.running)
                s->stats->in.remaining += diff;
        }
    }

    if (conf_get_bool(s->conf, CONF_compression) !=
        conf_get_bool(conf, CONF_compression)) {
        rekey_reason = "compression setting changed";
        rekey_mandatory = true;
    }

    for (i = 0; i < CIPHER_MAX; i++)
        if (conf_get_int_int(s->conf, CONF_ssh_cipherlist, i) !=
            conf_get_int_int(conf, CONF_ssh_cipherlist, i)) {
        rekey_reason = "cipher settings changed";
        rekey_mandatory = true;
    }
    if (conf_get_bool(s->conf, CONF_ssh2_des_cbc) !=
        conf_get_bool(conf, CONF_ssh2_des_cbc)) {
        rekey_reason = "cipher settings changed";
        rekey_mandatory = true;
    }

    conf_free(s->conf);
    s->conf = conf_copy(conf);

    if (rekey_reason) {
        if (!s->kex_in_progress && !ssh2_bpp_rekey_inadvisable(s->ppl.bpp)) {
            s->rekey_reason = rekey_reason;
            s->rekey_class = RK_NORMAL;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
        } else if (rekey_mandatory) {
            s->deferred_rekey_reason = rekey_reason;
        }
    }

    /* Also pass the configuration along to our higher layer */
    ssh_ppl_reconfigure(s->higher_layer, conf);
}